

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<QToolBarItem_*>::remove(QList<QToolBarItem_*> *this,char *__filename)

{
  QList<QToolBarItem_*> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  QToolBarItem **in_stack_00000018;
  QPodArrayOps<QToolBarItem_*> *in_stack_00000020;
  QArrayDataPointer<QToolBarItem_*> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QToolBarItem_*>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QToolBarItem_*>::operator->(&this->d);
    QArrayDataPointer<QToolBarItem_*>::operator->(&this->d);
    QArrayDataPointer<QToolBarItem_*>::begin((QArrayDataPointer<QToolBarItem_*> *)0x701179);
    QtPrivate::QPodArrayOps<QToolBarItem_*>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}